

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O1

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantsFromIds
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,ConstantManager *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  uint32_t *puVar1;
  Constant *pCVar2;
  uint32_t *puVar3;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  constants;
  Constant *c;
  pointer local_58;
  iterator iStack_50;
  pointer local_48;
  Constant *local_38;
  
  local_58 = (pointer)0x0;
  iStack_50._M_current = (pointer)0x0;
  local_48 = (pointer)0x0;
  puVar3 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    do {
      pCVar2 = FindDeclaredConstant(this,*puVar3);
      local_38 = pCVar2;
      if (pCVar2 == (Constant *)0x0) {
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else if (iStack_50._M_current == local_48) {
        std::
        vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
        ::_M_realloc_insert<spvtools::opt::analysis::Constant_const*const&>
                  ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                    *)&local_58,iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = pCVar2;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      if (pCVar2 == (Constant *)0x0) goto LAB_001e0f68;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = iStack_50._M_current;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  local_58 = (pointer)0x0;
  iStack_50._M_current = (pointer)0x0;
  local_48 = (pointer)0x0;
LAB_001e0f68:
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Constant*> ConstantManager::GetConstantsFromIds(
    const std::vector<uint32_t>& ids) const {
  std::vector<const Constant*> constants;
  for (uint32_t id : ids) {
    if (const Constant* c = FindDeclaredConstant(id)) {
      constants.push_back(c);
    } else {
      return {};
    }
  }
  return constants;
}